

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

int32_t __thiscall icu_63::UnifiedCache::_computeCountOfItemsToEvict(UnifiedCache *this)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = uhash_count_63(this->fHashtable);
  iVar2 = (this->fMaxPercentageOfInUse * this->fNumValuesInUse) / 100;
  if (iVar2 <= this->fMaxUnused) {
    iVar2 = this->fMaxUnused;
  }
  iVar2 = iVar1 - (iVar2 + this->fNumValuesInUse);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32_t UnifiedCache::_computeCountOfItemsToEvict() const {
    int32_t totalItems = uhash_count(fHashtable);
    int32_t evictableItems = totalItems - fNumValuesInUse;

    int32_t unusedLimitByPercentage = fNumValuesInUse * fMaxPercentageOfInUse / 100;
    int32_t unusedLimit = std::max(unusedLimitByPercentage, fMaxUnused);
    int32_t countOfItemsToEvict = std::max(0, evictableItems - unusedLimit);
    return countOfItemsToEvict;
}